

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O1

void assume_value_suite::get_string(void)

{
  ushort uVar1;
  ushort uVar2;
  wchar_t wVar3;
  int iVar4;
  char *__function;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  bool bVar8;
  string value;
  variable data;
  wchar_t *local_e8;
  ulong local_e0;
  long local_d8 [2];
  type local_c8;
  char local_a8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_98;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_78;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_e8 = (wchar_t *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"alpha","");
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_38,local_e8,local_e0 + (long)local_e8);
  trial::dynamic::basic_variable<std::allocator<char>>::basic_variable<std::__cxx11::string>
            ((basic_variable<std::allocator<char>> *)&local_c8.__align,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 == '\x0f') {
    if (local_c8._8_8_ == local_e0) {
      if (local_c8._8_8_ == 0) {
        bVar8 = true;
      }
      else {
        iVar4 = bcmp((void *)local_c8._0_8_,local_e8,local_c8._8_8_);
        bVar8 = iVar4 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    boost::detail::test_impl
              ("data.assume_value<variable::string_type>() == value",
               "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
               ,0x13ba,"void assume_value_suite::get_string()",bVar8);
    trial::dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
              ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                *)&local_c8.__align);
    if (local_e8 != (wchar_t *)local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
    trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
              ((basic_variable<std::allocator<char>_> *)&local_c8.__align,"alpha");
    if (local_a8 == '\x0f') {
      iVar4 = std::__cxx11::string::compare((char *)local_c8.__data);
      boost::detail::test_impl
                ("data.assume_value<variable::string_type>() == value",
                 "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                 ,0x13c0,"void assume_value_suite::get_string()",iVar4 == 0);
      trial::dynamic::detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
      ::
      call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                  *)&local_c8.__align);
      local_e8 = (wchar_t *)local_d8;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_e8,L"bravo",L"");
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_58,local_e8,local_e8 + local_e0);
      trial::dynamic::basic_variable<std::allocator<char>>::basic_variable<std::__cxx11::wstring>
                ((basic_variable<std::allocator<char>> *)&local_c8.__align,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity * 4 + 4);
      }
      if (local_a8 == '\x10') {
        if (local_c8._8_8_ == local_e0) {
          if (local_c8._8_8_ == 0) {
            bVar8 = true;
          }
          else {
            iVar4 = wmemcmp((wchar_t *)local_c8._0_8_,local_e8,local_c8._8_8_);
            bVar8 = iVar4 == 0;
          }
        }
        else {
          bVar8 = false;
        }
        boost::detail::test_impl
                  ("data.assume_value<variable::wstring_type>() == value",
                   "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                   ,0x13c6,"void assume_value_suite::get_string()",bVar8);
        trial::dynamic::detail::
        small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
        ::
        call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                  ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                    *)&local_c8.__align);
        if (local_e8 != (wchar_t *)local_d8) {
          operator_delete(local_e8,local_d8[0] * 4 + 4);
        }
        trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
                  ((basic_variable<std::allocator<char>_> *)&local_c8.__align,L"bravo");
        if (local_a8 == '\x10') {
          iVar4 = std::__cxx11::wstring::compare((wchar_t *)local_c8.__data);
          boost::detail::test_impl
                    ("data.assume_value<variable::wstring_type>() == value",
                     "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                     ,0x13cc,"void assume_value_suite::get_string()",iVar4 == 0);
          trial::dynamic::detail::
          small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
          ::
          call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                    ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                      *)&local_c8.__align);
          local_e8 = (wchar_t *)local_d8;
          std::__cxx11::u16string::_M_construct<char16_t_const*>
                    ((u16string *)&local_e8,L"charlie",L"");
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::u16string::_M_construct<char16_t*>
                    ((u16string *)&local_78,local_e8,(long)local_e8 + local_e0 * 2);
          trial::dynamic::basic_variable<std::allocator<char>>::
          basic_variable<std::__cxx11::u16string>
                    ((basic_variable<std::allocator<char>> *)&local_c8.__align,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 2 + 2
                           );
          }
          if (local_a8 == '\x11') {
            uVar6 = local_c8._8_8_;
            if (local_e0 < (ulong)local_c8._8_8_) {
              uVar6 = local_e0;
            }
            bVar8 = true;
            if (uVar6 == 0) {
              lVar5 = 0;
            }
            else {
              uVar7 = 0;
              do {
                uVar1 = *(ushort *)(local_c8._0_8_ + uVar7 * 2);
                uVar2 = *(ushort *)((long)local_e8 + uVar7 * 2);
                if (uVar1 < uVar2) {
                  lVar5 = 0xffffffff;
LAB_001379a9:
                  bVar8 = false;
                  break;
                }
                lVar5 = 0;
                if (uVar2 < uVar1) {
                  lVar5 = 1;
                  goto LAB_001379a9;
                }
                uVar7 = uVar7 + 1;
              } while (uVar6 != uVar7);
            }
            if (bVar8) {
              lVar5 = -0x80000000;
              if (-0x80000000 < (long)(local_c8._8_8_ - local_e0)) {
                lVar5 = local_c8._8_8_ - local_e0;
              }
              if (0x7ffffffe < lVar5) {
                lVar5 = 0x7fffffff;
              }
            }
            boost::detail::test_impl
                      ("data.assume_value<variable::u16string_type>() == value",
                       "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                       ,0x13d2,"void assume_value_suite::get_string()",(int)lVar5 == 0);
            trial::dynamic::detail::
            small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
            ::
            call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                      ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                        *)&local_c8.__align);
            if (local_e8 != (wchar_t *)local_d8) {
              operator_delete(local_e8,local_d8[0] * 2 + 2);
            }
            trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
                      ((basic_variable<std::allocator<char>_> *)&local_c8.__align,L"charlie");
            if (local_a8 == '\x11') {
              iVar4 = std::__cxx11::
                      basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                      ::compare((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                                 *)&local_c8.__align,L"charlie");
              boost::detail::test_impl
                        ("data.assume_value<variable::u16string_type>() == value",
                         "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                         ,0x13d8,"void assume_value_suite::get_string()",iVar4 == 0);
              trial::dynamic::detail::
              small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              ::
              call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                        ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                          *)&local_c8.__align);
              local_e8 = (wchar_t *)local_d8;
              std::__cxx11::u32string::_M_construct<char32_t_const*>
                        ((u32string *)&local_e8,L"delta",L"");
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::u32string::_M_construct<char32_t*>
                        ((u32string *)&local_98,local_e8,local_e8 + local_e0);
              trial::dynamic::basic_variable<std::allocator<char>>::
              basic_variable<std::__cxx11::u32string>
                        ((basic_variable<std::allocator<char>> *)&local_c8.__align,&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,
                                local_98.field_2._M_allocated_capacity * 4 + 4);
              }
              if (local_a8 == '\x12') {
                uVar6 = local_c8._8_8_;
                if (local_e0 < (ulong)local_c8._8_8_) {
                  uVar6 = local_e0;
                }
                bVar8 = true;
                if (uVar6 == 0) {
                  lVar5 = 0;
                }
                else {
                  uVar7 = 0;
                  do {
                    wVar3 = *(wchar_t *)(local_c8._0_8_ + uVar7 * 4);
                    if ((uint)wVar3 < (uint)local_e8[uVar7]) {
                      lVar5 = 0xffffffff;
LAB_00137b43:
                      bVar8 = false;
                      break;
                    }
                    lVar5 = 0;
                    if ((uint)local_e8[uVar7] < (uint)wVar3) {
                      lVar5 = 1;
                      goto LAB_00137b43;
                    }
                    uVar7 = uVar7 + 1;
                  } while (uVar6 != uVar7);
                }
                if (bVar8) {
                  lVar5 = -0x80000000;
                  if (-0x80000000 < (long)(local_c8._8_8_ - local_e0)) {
                    lVar5 = local_c8._8_8_ - local_e0;
                  }
                  if (0x7ffffffe < lVar5) {
                    lVar5 = 0x7fffffff;
                  }
                }
                boost::detail::test_impl
                          ("data.assume_value<variable::u32string_type>() == value",
                           "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                           ,0x13de,"void assume_value_suite::get_string()",(int)lVar5 == 0);
                trial::dynamic::detail::
                small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                ::
                call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                          ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                            *)&local_c8.__align);
                if (local_e8 != (wchar_t *)local_d8) {
                  operator_delete(local_e8,local_d8[0] * 4 + 4);
                }
                trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
                          ((basic_variable<std::allocator<char>_> *)&local_c8.__align,L"delta");
                if (local_a8 == '\x12') {
                  iVar4 = std::__cxx11::
                          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          ::compare((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                     *)&local_c8.__align,L"delta");
                  boost::detail::test_impl
                            ("data.assume_value<variable::u32string_type>() == value",
                             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
                             ,0x13e4,"void assume_value_suite::get_string()",iVar4 == 0);
                  trial::dynamic::detail::
                  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                  ::
                  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
                            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
                              *)&local_c8.__align);
                  return;
                }
              }
              __function = 
              "R &trial::dynamic::basic_variable<std::allocator<char>>::assume_value() & [Allocator = std::allocator<char>, R = std::basic_string<char32_t>]"
              ;
              goto LAB_00137c7f;
            }
          }
          __function = 
          "R &trial::dynamic::basic_variable<std::allocator<char>>::assume_value() & [Allocator = std::allocator<char>, R = std::basic_string<char16_t>]"
          ;
          goto LAB_00137c7f;
        }
      }
      __function = 
      "R &trial::dynamic::basic_variable<std::allocator<char>>::assume_value() & [Allocator = std::allocator<char>, R = std::basic_string<wchar_t>]"
      ;
      goto LAB_00137c7f;
    }
  }
  __function = 
  "R &trial::dynamic::basic_variable<std::allocator<char>>::assume_value() & [Allocator = std::allocator<char>, R = std::basic_string<char>]"
  ;
LAB_00137c7f:
  __assert_fail("same<R>()",
                "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/cmake/../include/trial/dynamic/detail/variable.ipp"
                ,0xd31,__function);
}

Assistant:

void construct_array_from_iterator()
{
    std::vector<variable> input = { 1, 2 };
    variable data = array::make(input.begin(), input.end());
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
}